

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmSwitch(ExpressionContext *ctx,VmModule *module,ExprSwitch *node)

{
  LoopInfo *pLVar1;
  Allocator *pAVar2;
  int iVar3;
  VmBlock *pVVar4;
  VmBlock *block;
  VmBlock *block_00;
  VmValue *pVVar5;
  undefined4 extraout_var;
  ulong uVar6;
  char *__function;
  ExprBase *pEVar7;
  uint uVar8;
  uint uVar9;
  SmallArray<VmBlock_*,_16U> caseBlocks;
  SmallArray<VmBlock_*,_16U> conditionBlocks;
  SmallArray<VmBlock_*,_16U> local_160;
  SmallArray<VmBlock_*,_16U> local_c8;
  
  CompileVm(ctx,module,node->condition);
  local_160.allocator = module->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_160.data = local_160.little;
  local_160.count = 0;
  local_160.max = 0x10;
  pEVar7 = (node->cases).head;
  local_c8.allocator = local_160.allocator;
  if (pEVar7 != (ExprBase *)0x0) {
    do {
      pVVar4 = anon_unknown.dwarf_233176::CreateBlock
                         (module,(node->super_ExprBase).source,"switch_case");
      if (local_c8.count == local_c8.max) {
        SmallArray<VmBlock_*,_16U>::grow(&local_c8,local_c8.count);
      }
      if (local_c8.data == (VmBlock **)0x0) goto LAB_002871d9;
      uVar6 = (ulong)local_c8.count;
      local_c8.count = local_c8.count + 1;
      local_c8.data[uVar6] = pVVar4;
      pEVar7 = pEVar7->next;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  pEVar7 = (node->blocks).head;
  if (pEVar7 != (ExprBase *)0x0) {
    do {
      pVVar4 = anon_unknown.dwarf_233176::CreateBlock
                         (module,(node->super_ExprBase).source,"case_block");
      if (local_160.count == local_160.max) {
        SmallArray<VmBlock_*,_16U>::grow(&local_160,local_160.count);
      }
      if (local_160.data == (VmBlock **)0x0) goto LAB_002871d9;
      uVar6 = (ulong)local_160.count;
      local_160.count = local_160.count + 1;
      local_160.data[uVar6] = pVVar4;
      pEVar7 = pEVar7->next;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  block = anon_unknown.dwarf_233176::CreateBlock
                    (module,(node->super_ExprBase).source,"default_block");
  block_00 = anon_unknown.dwarf_233176::CreateBlock
                       (module,(node->super_ExprBase).source,"switch_exit");
  pVVar4 = block;
  if (local_c8.count != 0) {
    pVVar4 = *local_c8.data;
  }
  anon_unknown.dwarf_233176::CreateJump(module,(node->super_ExprBase).source,&pVVar4->super_VmValue)
  ;
  pEVar7 = (node->cases).head;
  if (pEVar7 != (ExprBase *)0x0) {
    uVar8 = 1;
    do {
      uVar9 = uVar8 - 1;
      if (local_c8.count <= uVar9) goto LAB_002871ba;
      VmFunction::AddBlock(module->currentFunction,local_c8.data[uVar9]);
      if (local_c8.count <= uVar9) goto LAB_002871ba;
      module->currentBlock = local_c8.data[uVar9];
      pVVar5 = CompileVm(ctx,module,pEVar7);
      if (local_160.count <= uVar9) goto LAB_002871ba;
      pVVar4 = block;
      if (pEVar7->next != (ExprBase *)0x0) {
        if (local_c8.count <= uVar8) goto LAB_002871ba;
        pVVar4 = local_c8.data[uVar8];
      }
      anon_unknown.dwarf_233176::CreateJumpNotZero
                (module,(node->super_ExprBase).source,pVVar5,&local_160.data[uVar9]->super_VmValue,
                 &pVVar4->super_VmValue);
      pEVar7 = pEVar7->next;
      uVar8 = uVar8 + 1;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  uVar8 = (module->loopInfo).count;
  if (uVar8 == (module->loopInfo).max) {
    SmallArray<VmModule::LoopInfo,_32U>::grow(&module->loopInfo,uVar8);
  }
  pLVar1 = (module->loopInfo).data;
  if (pLVar1 != (LoopInfo *)0x0) {
    uVar8 = (module->loopInfo).count;
    (module->loopInfo).count = uVar8 + 1;
    pLVar1[uVar8].breakBlock = block_00;
    pLVar1[uVar8].continueBlock = (VmBlock *)0x0;
    pEVar7 = (node->blocks).head;
    if (pEVar7 != (ExprBase *)0x0) {
      uVar8 = 1;
      do {
        uVar9 = uVar8 - 1;
        if (local_160.count <= uVar9) {
LAB_002871ba:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmBlock *, 16>::operator[](unsigned int) [T = VmBlock *, N = 16]"
                       );
        }
        VmFunction::AddBlock(module->currentFunction,local_160.data[uVar9]);
        if (local_160.count <= uVar9) goto LAB_002871ba;
        module->currentBlock = local_160.data[uVar9];
        CompileVm(ctx,module,pEVar7);
        pVVar4 = block;
        if (pEVar7->next != (ExprBase *)0x0) {
          if (local_160.count <= uVar8) goto LAB_002871ba;
          pVVar4 = local_160.data[uVar8];
        }
        anon_unknown.dwarf_233176::CreateJump
                  (module,(node->super_ExprBase).source,&pVVar4->super_VmValue);
        pEVar7 = pEVar7->next;
        uVar8 = uVar8 + 1;
      } while (pEVar7 != (ExprBase *)0x0);
    }
    VmFunction::AddBlock(module->currentFunction,block);
    module->currentBlock = block;
    if (node->defaultBlock != (ExprBase *)0x0) {
      CompileVm(ctx,module,node->defaultBlock);
    }
    anon_unknown.dwarf_233176::CreateJump
              (module,(node->super_ExprBase).source,&block_00->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    uVar8 = (module->loopInfo).count;
    if (uVar8 != 0) {
      (module->loopInfo).count = uVar8 - 1;
      iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
      pVVar5 = (VmValue *)CONCAT44(extraout_var,iVar3);
      pAVar2 = module->allocator;
      pVVar5->typeID = 0;
      (pVVar5->type).type = VM_TYPE_VOID;
      (pVVar5->type).size = 0;
      (pVVar5->type).structType = (TypeBase *)0x0;
      pVVar5->source = (SynBase *)0x0;
      (pVVar5->comment).begin = (char *)0x0;
      (pVVar5->comment).end = (char *)0x0;
      (pVVar5->users).allocator = pAVar2;
      (pVVar5->users).data = (pVVar5->users).little;
      (pVVar5->users).count = 0;
      (pVVar5->users).max = 8;
      pVVar5->hasSideEffects = false;
      pVVar5->hasMemoryAccess = false;
      pVVar5->canBeRemoved = true;
      pVVar5->hasKnownSimpleUse = false;
      pVVar5->hasKnownNonSimpleUse = false;
      pVVar5->_vptr_VmValue = (_func_int **)&PTR__VmValue_003f8c60;
      anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,pVVar5);
      SmallArray<VmBlock_*,_16U>::~SmallArray(&local_160);
      SmallArray<VmBlock_*,_16U>::~SmallArray(&local_c8);
      return pVVar5;
    }
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x183,
                  "void SmallArray<VmModule::LoopInfo, 32>::pop_back() [T = VmModule::LoopInfo, N = 32]"
                 );
  }
  __function = 
  "void SmallArray<VmModule::LoopInfo, 32>::push_back(const T &) [T = VmModule::LoopInfo, N = 32]";
LAB_002871ee:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
LAB_002871d9:
  __function = "void SmallArray<VmBlock *, 16>::push_back(const T &) [T = VmBlock *, N = 16]";
  goto LAB_002871ee;
}

Assistant:

VmValue* CompileVmSwitch(ExpressionContext &ctx, VmModule *module, ExprSwitch *node)
{
	CompileVm(ctx, module, node->condition);

	SmallArray<VmBlock*, 16> conditionBlocks(module->allocator);
	SmallArray<VmBlock*, 16> caseBlocks(module->allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(CreateBlock(module, node->source, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(CreateBlock(module, node->source, "case_block"));

	VmBlock *defaultBlock = CreateBlock(module, node->source, "default_block");
	VmBlock *exitBlock = CreateBlock(module, node->source, "switch_exit");

	CreateJump(module, node->source, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(conditionBlocks[i]);
		module->currentBlock = conditionBlocks[i];

		VmValue *condition = CompileVm(ctx, module, curr);

		CreateJumpNotZero(module, node->source, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		module->currentFunction->AddBlock(caseBlocks[i]);
		module->currentBlock = caseBlocks[i];

		CompileVm(ctx, module, curr);

		CreateJump(module, node->source, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	module->currentFunction->AddBlock(defaultBlock);
	module->currentBlock = defaultBlock;

	if(node->defaultBlock)
		CompileVm(ctx, module, node->defaultBlock);
	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}